

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Clip_x86_avx512::forward_inplace(Clip_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [64];
  int iVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var3 = this->_vptr_Clip_x86_avx512;
    lVar10 = 0;
    do {
      pauVar11 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar6 < 0x10) {
        uVar8 = 0;
      }
      else {
        auVar13 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var3[-3])));
        auVar14 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var3[-3])));
        iVar12 = 0xf;
        do {
          auVar15 = vmaxps_avx512f(auVar13,*pauVar11);
          auVar15 = vminps_avx512f(auVar15,auVar14);
          *pauVar11 = auVar15;
          pauVar11 = pauVar11 + 1;
          iVar12 = iVar12 + 0x10;
          uVar8 = uVar6 & 0xfffffff0;
        } while (iVar12 < (int)uVar6);
      }
      if ((int)(uVar8 | 7) < (int)uVar6) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        uVar7 = uVar8;
        do {
          auVar5 = vmaxps_avx(auVar17,*(undefined1 (*) [32])*pauVar11);
          auVar5 = vminps_avx(auVar5,auVar19);
          *(undefined1 (*) [32])*pauVar11 = auVar5;
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x20);
          uVar8 = uVar7 + 8;
          iVar12 = uVar7 + 0xf;
          uVar7 = uVar8;
        } while (iVar12 < (int)uVar6);
      }
      if ((int)(uVar8 | 3) < (int)uVar6) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar16._4_4_ = uVar1;
        auVar16._0_4_ = uVar1;
        auVar16._8_4_ = uVar1;
        auVar16._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        uVar7 = uVar8;
        do {
          auVar4 = vmaxps_avx(auVar16,*(undefined1 (*) [16])*pauVar11);
          auVar4 = vminps_avx(auVar4,auVar18);
          *(undefined1 (*) [16])*pauVar11 = auVar4;
          pauVar11 = (undefined1 (*) [64])(*pauVar11 + 0x10);
          uVar8 = uVar7 + 4;
          iVar12 = uVar7 + 7;
          uVar7 = uVar8;
        } while (iVar12 < (int)uVar6);
      }
      if (uVar6 - uVar8 != 0 && (int)uVar8 <= (int)uVar6) {
        lVar9 = 0;
        do {
          if (*(float *)(*pauVar11 + lVar9 * 4) < *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]))
          {
            *(float *)(*pauVar11 + lVar9 * 4) = *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          }
          if (*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]) < *(float *)(*pauVar11 + lVar9 * 4))
          {
            *(float *)(*pauVar11 + lVar9 * 4) = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          }
          lVar9 = lVar9 + 1;
        } while (uVar6 - uVar8 != (int)lVar9);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int Clip_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}